

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathRect(ImDrawList *this,ImVec2 *a,ImVec2 *b,float rounding,int rounding_corners)

{
  int *piVar1;
  int iVar2;
  ImVec2 *pIVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  ImVec2 *pIVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float radius;
  ImVec2 local_38;
  
  pIVar4 = GImGui;
  uVar5 = ~rounding_corners;
  fVar10 = 0.5;
  if ((uVar5 & 0xc) != 0) {
    fVar10 = 1.0;
  }
  fVar11 = 0.5;
  if ((uVar5 & 3) != 0) {
    fVar11 = fVar10;
  }
  fVar10 = 0.5;
  if ((uVar5 & 6) != 0) {
    fVar10 = 1.0;
  }
  fVar9 = 0.5;
  if ((uVar5 & 9) != 0) {
    fVar9 = fVar10;
  }
  if (rounding_corners != 0) {
    fVar10 = ABS(b->x - a->x) * fVar11 + -1.0;
    if (fVar10 <= rounding) {
      rounding = fVar10;
    }
    fVar10 = ABS(b->y - a->y) * fVar9 + -1.0;
    if (fVar10 <= rounding) {
      rounding = fVar10;
    }
    if (0.0 < rounding) {
      fVar10 = 0.0;
      if ((rounding_corners & 1U) != 0) {
        fVar10 = rounding;
      }
      fVar11 = 0.0;
      if ((rounding_corners & 2U) != 0) {
        fVar11 = rounding;
      }
      fVar9 = 0.0;
      if ((rounding_corners & 4U) != 0) {
        fVar9 = rounding;
      }
      radius = 0.0;
      if ((rounding_corners & 8U) != 0) {
        radius = rounding;
      }
      local_38.x = a->x + fVar10;
      local_38.y = a->y + fVar10;
      PathArcToFast(this,&local_38,fVar10,6,9);
      local_38.x = b->x - fVar11;
      local_38.y = a->y + fVar11;
      PathArcToFast(this,&local_38,fVar11,9,0xc);
      local_38.x = b->x - fVar9;
      local_38.y = b->y - fVar9;
      PathArcToFast(this,&local_38,fVar9,0,3);
      local_38.x = a->x + radius;
      local_38.y = b->y - radius;
      PathArcToFast(this,&local_38,radius,3,6);
      return;
    }
  }
  iVar8 = (this->_Path).Size;
  iVar2 = (this->_Path).Capacity;
  if (iVar8 == iVar2) {
    iVar8 = iVar8 + 1;
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    if (iVar8 < iVar7) {
      iVar8 = iVar7;
    }
    if (iVar2 < iVar8) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      pIVar6 = (ImVec2 *)(*(pIVar4->IO).MemAllocFn)((long)iVar8 << 3);
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        memcpy(pIVar6,pIVar3,(long)(this->_Path).Size << 3);
      }
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(pIVar3);
      (this->_Path).Data = pIVar6;
      (this->_Path).Capacity = iVar8;
    }
  }
  iVar8 = (this->_Path).Size;
  (this->_Path).Size = iVar8 + 1;
  (this->_Path).Data[iVar8] = *a;
  pIVar4 = GImGui;
  fVar10 = b->x;
  fVar11 = a->y;
  iVar8 = (this->_Path).Size;
  iVar2 = (this->_Path).Capacity;
  if (iVar8 == iVar2) {
    iVar8 = iVar8 + 1;
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    if (iVar8 < iVar7) {
      iVar8 = iVar7;
    }
    if (iVar2 < iVar8) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      pIVar6 = (ImVec2 *)(*(pIVar4->IO).MemAllocFn)((long)iVar8 << 3);
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        memcpy(pIVar6,pIVar3,(long)(this->_Path).Size << 3);
      }
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(pIVar3);
      (this->_Path).Data = pIVar6;
      (this->_Path).Capacity = iVar8;
    }
  }
  pIVar3 = (this->_Path).Data;
  iVar8 = (this->_Path).Size;
  (this->_Path).Size = iVar8 + 1;
  pIVar3[iVar8].x = fVar10;
  pIVar3[iVar8].y = fVar11;
  pIVar4 = GImGui;
  iVar8 = (this->_Path).Size;
  iVar2 = (this->_Path).Capacity;
  if (iVar8 == iVar2) {
    iVar8 = iVar8 + 1;
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    if (iVar8 < iVar7) {
      iVar8 = iVar7;
    }
    if (iVar2 < iVar8) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      pIVar6 = (ImVec2 *)(*(pIVar4->IO).MemAllocFn)((long)iVar8 << 3);
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        memcpy(pIVar6,pIVar3,(long)(this->_Path).Size << 3);
      }
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(pIVar3);
      (this->_Path).Data = pIVar6;
      (this->_Path).Capacity = iVar8;
    }
  }
  iVar8 = (this->_Path).Size;
  (this->_Path).Size = iVar8 + 1;
  (this->_Path).Data[iVar8] = *b;
  pIVar4 = GImGui;
  fVar10 = a->x;
  fVar11 = b->y;
  iVar8 = (this->_Path).Size;
  iVar2 = (this->_Path).Capacity;
  if (iVar8 == iVar2) {
    iVar8 = iVar8 + 1;
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    if (iVar8 < iVar7) {
      iVar8 = iVar7;
    }
    if (iVar2 < iVar8) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      pIVar6 = (ImVec2 *)(*(pIVar4->IO).MemAllocFn)((long)iVar8 << 3);
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        memcpy(pIVar6,pIVar3,(long)(this->_Path).Size << 3);
      }
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(pIVar3);
      (this->_Path).Data = pIVar6;
      (this->_Path).Capacity = iVar8;
    }
  }
  pIVar3 = (this->_Path).Data;
  iVar8 = (this->_Path).Size;
  (this->_Path).Size = iVar8 + 1;
  pIVar3[iVar8].x = fVar10;
  pIVar3[iVar8].y = fVar11;
  return;
}

Assistant:

void ImDrawList::PathRect(const ImVec2& a, const ImVec2& b, float rounding, int rounding_corners)
{
    float r = rounding;
    r = ImMin(r, fabsf(b.x-a.x) * ( ((rounding_corners&(1|2))==(1|2)) || ((rounding_corners&(4|8))==(4|8)) ? 0.5f : 1.0f ) - 1.0f);
    r = ImMin(r, fabsf(b.y-a.y) * ( ((rounding_corners&(1|8))==(1|8)) || ((rounding_corners&(2|4))==(2|4)) ? 0.5f : 1.0f ) - 1.0f);

    if (r <= 0.0f || rounding_corners == 0)
    {
        PathLineTo(a);
        PathLineTo(ImVec2(b.x,a.y));
        PathLineTo(b);
        PathLineTo(ImVec2(a.x,b.y));
    }
    else
    {
        const float r0 = (rounding_corners & 1) ? r : 0.0f;
        const float r1 = (rounding_corners & 2) ? r : 0.0f;
        const float r2 = (rounding_corners & 4) ? r : 0.0f;
        const float r3 = (rounding_corners & 8) ? r : 0.0f;
        PathArcToFast(ImVec2(a.x+r0,a.y+r0), r0, 6, 9);
        PathArcToFast(ImVec2(b.x-r1,a.y+r1), r1, 9, 12);
        PathArcToFast(ImVec2(b.x-r2,b.y-r2), r2, 0, 3);
        PathArcToFast(ImVec2(a.x+r3,b.y-r3), r3, 3, 6);
    }
}